

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O3

error<idx2::err_code> idx2::ReadVolume(cstr FileName,v3i *Dims3,dtype Type,volume *Volume)

{
  dtype dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar9;
  volume local_68;
  grid local_40;
  
  iVar5 = 0;
  if (Type < __Invalid__) {
    iVar5 = *(int *)(&DAT_001a8e58 + (ulong)Type * 4);
  }
  if ((long)((Dims3->field_0).field_0.Y * (Dims3->field_0).field_0.X * (Dims3->field_0).field_0.Z *
            iVar5) < (Volume->Buffer).Bytes) {
    dVar1 = Volume->Type;
    if (Mallocator()::Instance == '\0') {
      ReadVolume();
    }
    if (Mallocator()::Instance == '\0') {
      ReadVolume();
    }
    local_68.Buffer.Data = (byte *)0x0;
    local_68.Buffer.Bytes = 0;
    local_68.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
    uVar2 = (Dims3->field_0).field_0.X;
    uVar3 = (Dims3->field_0).field_0.Y;
    uVar4 = (Dims3->field_0).field_0.Z;
    local_68.Dims =
         (ulong)(uVar4 & 0x1fffff) << 0x2a |
         ((ulong)uVar3 & 0x1fffff) << 0x15 | (ulong)uVar2 & 0x1fffff;
    if (dVar1 < __Invalid__) {
      lVar6 = *(long *)(&DAT_001a8e80 + (ulong)dVar1 * 8);
    }
    else {
      lVar6 = 0;
    }
    local_68.Type = dVar1;
    AllocBuf(&local_68.Buffer,(int)uVar4 * lVar6 * (long)(int)uVar3 * (long)(int)uVar2,
             (allocator *)&Mallocator()::Instance);
    eVar9 = ReadFile(FileName,&local_68.Buffer);
    pcVar8 = eVar9.Msg;
    if (eVar9.Code == NoError) {
      if (Volume->Type == float64) {
        local_40.super_extent.From = 0;
        local_40.super_extent.Dims =
             (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff;
        local_40.Strd = 0x40000200001;
        Copy<double>(&local_40,&local_68,Volume);
      }
      else if (Volume->Type == float32) {
        local_40.super_extent.From = 0;
        local_40.super_extent.Dims =
             (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff;
        local_40.Strd = 0x40000200001;
        Copy<float>(&local_40,&local_68,Volume);
      }
      *(char **)(*in_FS_OFFSET + -0x780) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x37;
      pcVar8 = "";
      uVar7 = 0;
    }
    else {
      uVar7 = eVar9._8_8_ & 0xffffffffffff;
    }
    DeallocBuf(&local_68.Buffer);
  }
  else {
    eVar9 = ReadFile(FileName,&Volume->Buffer);
    pcVar8 = eVar9.Msg;
    if (eVar9.Code == NoError) {
      Volume->Dims = (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
                     ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15 |
                     (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff;
      Volume->Type = Type;
      *(char **)(*in_FS_OFFSET + -0x780) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x39;
      pcVar8 = "";
      uVar7 = 0;
    }
    else {
      uVar7 = eVar9._8_8_ & 0xffffffffffff;
    }
  }
  eVar9.Code = (int)uVar7;
  eVar9.StackIdx = (char)(uVar7 >> 0x20);
  eVar9.StrGened = (bool)(char)(uVar7 >> 0x28);
  eVar9._14_2_ = (short)(uVar7 >> 0x30);
  eVar9.Msg = pcVar8;
  return eVar9;
}

Assistant:

error<>
ReadVolume(cstr FileName, const v3i& Dims3, dtype Type, volume* Volume)
{
  error Ok;
  if (Size(Volume->Buffer) <= Prod(Dims3) * SizeOf(Type))
  {
    Ok = ReadFile(FileName, &Volume->Buffer);
    if (Ok.Code != err_code::NoError)
      return Ok;
    *Volume = volume(Volume->Buffer, Dims3, Type);
  }
  else
  { // volume's buffer is larger than the input
    idx2_Assert(Dims3 <= Dims(*Volume));
    idx2_Assert(Volume->Type != dtype::__Invalid__);
    volume Temp(Dims3, Volume->Type);
    idx2_CleanUp(Dealloc(&Temp));
    Ok = ReadFile(FileName, &Temp.Buffer);
    if (Ok.Code != err_code::NoError)
      return Ok;
    if (Volume->Type == dtype::float32)
      Copy<f32>(grid(Dims3), Temp, Volume);
    else if (Volume->Type == dtype::float64)
      Copy<f64>(grid(Dims3), Temp, Volume);
    return idx2_Error(err_code::NoError);
  }
  return idx2_Error(err_code::NoError);
}